

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferOperationsViaFrambufferReadBack::getFBVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaFrambufferReadBack *this)

{
  stringstream strstream;
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(&local_180,
                  "${VERSION}\n\nprecision highp float;\n\nin vec4 inPosition;\n\nvoid main(void)\n{\n    gl_Position = inPosition;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaFrambufferReadBack::getFBVertexShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "in vec4 inPosition;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    gl_Position = inPosition;\n"
				 "}\n";

	return strstream.str();
}